

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

string * __thiscall
pbrt::MIPMapFilterOptions::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MIPMapFilterOptions *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::FilterFunction_const&,float_const&>
            (__return_storage_ptr__,"[ MIPMapFilterOptions filter: %s maxAnisotropy: %f ]",
             &this->filter,&this->maxAnisotropy);
  return __return_storage_ptr__;
}

Assistant:

std::string MIPMapFilterOptions::ToString() const {
    return StringPrintf("[ MIPMapFilterOptions filter: %s maxAnisotropy: %f ]", filter,
                        maxAnisotropy);
}